

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_primitive_isBootstrapPrimitive
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_context_t *context_00;
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  sysbvm_tuple_t sVar4;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
    closure = argumentCount;
  }
  context_00 = (sysbvm_context_t *)*arguments;
  _Var2 = sysbvm_tuple_isFunction(context_00,closure);
  if (_Var2) {
    uVar1 = (context_00->heap).nextGCSizeThreshold;
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      uVar3 = (uint)((long)uVar1 >> 4);
    }
    else {
      uVar3 = (uint)*(undefined8 *)(uVar1 + 0x10);
    }
    sVar4 = (ulong)(byte)((context_00->heap).gcRootTableAllocator.lastChunk ==
                          (sysbvm_chunkedAllocatorChunk_t *)0x0 | (byte)((uVar3 & 4) >> 2)) << 4 |
            0xf;
  }
  else {
    sVar4 = 0xf;
  }
  return sVar4;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_isBootstrapPrimitive(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    if(!sysbvm_tuple_isFunction(context, *function))
        return SYSBVM_FALSE_TUPLE;
    
    sysbvm_function_t **functionObject = (sysbvm_function_t **)function;
    size_t flags = sysbvm_tuple_bitflags_decode((*functionObject)->flags);
    bool isCorePrimitive = (flags & SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE) != 0;
    bool isUndefined = !(*functionObject)->definition;
    
    return sysbvm_tuple_boolean_encode(isCorePrimitive || isUndefined);
}